

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O1

Am_Value menu_bar_copy_item_to_command_proc(Am_Object *self)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar7;
  Am_Object *in_RSI;
  Am_Value AVar8;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  pAVar5 = Am_Object::Get(in_RSI,0xa3,1);
  Am_Value::operator=((Am_Value *)self,pAVar5);
  sVar1 = *(short *)&self->data;
  if (sVar1 == -0x5fff) {
    Am_Object::Am_Object(&local_28,(Am_Value *)self);
    bVar2 = Am_Object::Valid(&local_28);
    if (bVar2) {
      Am_Object::Am_Object(&local_30,(Am_Value *)self);
      Am_Object::Am_Object(&local_38,&Am_Command);
      bVar3 = Am_Object::Is_Instance_Of(&local_30,&local_38);
      bVar2 = true;
      goto LAB_002680c0;
    }
  }
  bVar2 = false;
  bVar3 = false;
LAB_002680c0:
  if (bVar2) {
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_30);
  }
  if (sVar1 == -0x5fff) {
    Am_Object::~Am_Object(&local_28);
  }
  if (bVar3 != false) {
    copy_item_to_command_proc(in_RSI,(Am_Value *)self);
    pAVar5 = Am_Object::Get(in_RSI,0x1d2,1);
    aVar7 = extraout_RDX;
    if (pAVar5->type != 0xa001) {
      Am_Object::Am_Object(&local_40,in_RSI);
      create_sub_menu_window(&local_40);
      Am_Object::~Am_Object(&local_40);
      aVar7 = extraout_RDX_00;
    }
    AVar8.value.wrapper_value = aVar7.wrapper_value;
    AVar8._0_8_ = self;
    return AVar8;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "In a menu_bar, the top-level items must be\ncommand objects, but for ",0x44);
  poVar6 = operator<<((ostream *)&std::cerr,in_RSI);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," item # ",8);
  pAVar5 = Am_Object::Get(in_RSI,0x85,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar4 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," is ",4);
  poVar6 = operator<<(poVar6,(Am_Value *)self);
  std::endl<char,std::char_traits<char>>(poVar6);
  Am_Error();
}

Assistant:

Am_Define_Formula(Am_Value, menu_bar_copy_item_to_command)
{
  Am_Value value;
  value = self.Peek(Am_ITEM);
  //if (!value.Exists()) return 0;
  if (value.type == Am_OBJECT && Am_Object(value).Valid() &&
      Am_Object(value).Is_Instance_Of(Am_Command)) {
    //then fine
  } else {
    Am_ERRORO(
        "In a menu_bar, the top-level items must be\ncommand objects, but for "
            << self << " item # " << (int)self.Get(Am_RANK) + 1 << " is "
            << value,
        self, Am_ITEM);
  }

  copy_item_to_command_proc(self, value);

  //now create the sub-menu if necessary
  if (self.Get_Slot_Type(Am_SUB_MENU) != Am_OBJECT) {
    create_sub_menu_window(self);
  }

  return (value);
}